

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

void __thiscall
btQuantizedBvh::reportAabbOverlappingNodex
          (btQuantizedBvh *this,btNodeOverlapCallback *nodeCallback,btVector3 *aabbMin,
          btVector3 *aabbMax)

{
  btQuantizedBvh *in_RCX;
  btNodeOverlapCallback *in_RDX;
  btQuantizedBvh *in_RSI;
  btNodeOverlapCallback *in_RDI;
  btQuantizedBvh *unaff_retaddr;
  btQuantizedBvhNode *in_stack_00000008;
  btQuantizedBvhNode *rootNode;
  unsigned_short quantizedQueryAabbMax [3];
  unsigned_short quantizedQueryAabbMin [3];
  undefined8 in_stack_ffffffffffffffc8;
  int iVar1;
  btVector3 *in_stack_ffffffffffffffd0;
  btVector3 *in_stack_ffffffffffffffd8;
  btNodeOverlapCallback *nodeCallback_00;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (((ulong)in_RDI[8]._vptr_btNodeOverlapCallback & 1) == 0) {
    walkStacklessTree(in_RSI,in_RDX,(btVector3 *)in_RCX,in_stack_ffffffffffffffd8);
  }
  else {
    nodeCallback_00 = in_RDI;
    quantizeWithClamp(in_RCX,(unsigned_short *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                      iVar1);
    quantizeWithClamp(in_RCX,(unsigned_short *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                      iVar1);
    iVar1 = *(int *)&in_RDI[0x19]._vptr_btNodeOverlapCallback;
    if (iVar1 == 0) {
      walkStacklessQuantizedTree
                (unaff_retaddr,nodeCallback_00,(unsigned_short *)in_RSI,(unsigned_short *)in_RDX,
                 (int)((ulong)in_RCX >> 0x20),(int)in_RCX);
    }
    else if (iVar1 == 1) {
      walkStacklessQuantizedTreeCacheFriendly
                (in_RSI,in_RDX,(unsigned_short *)in_RCX,(unsigned_short *)in_stack_ffffffffffffffd8)
      ;
    }
    else if (iVar1 == 2) {
      btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0x15),0);
      walkRecursiveQuantizedTreeAgainstQueryAabb
                ((btQuantizedBvh *)rootNode,in_stack_00000008,(btNodeOverlapCallback *)unaff_retaddr
                 ,(unsigned_short *)nodeCallback_00,(unsigned_short *)in_RSI);
    }
  }
  return;
}

Assistant:

void	btQuantizedBvh::reportAabbOverlappingNodex(btNodeOverlapCallback* nodeCallback,const btVector3& aabbMin,const btVector3& aabbMax) const
{
	//either choose recursive traversal (walkTree) or stackless (walkStacklessTree)

	if (m_useQuantization)
	{
		///quantize query AABB
		unsigned short int quantizedQueryAabbMin[3];
		unsigned short int quantizedQueryAabbMax[3];
		quantizeWithClamp(quantizedQueryAabbMin,aabbMin,0);
		quantizeWithClamp(quantizedQueryAabbMax,aabbMax,1);

		switch (m_traversalMode)
		{
		case TRAVERSAL_STACKLESS:
				walkStacklessQuantizedTree(nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax,0,m_curNodeIndex);
			break;
		case TRAVERSAL_STACKLESS_CACHE_FRIENDLY:
				walkStacklessQuantizedTreeCacheFriendly(nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);
			break;
		case TRAVERSAL_RECURSIVE:
			{
				const btQuantizedBvhNode* rootNode = &m_quantizedContiguousNodes[0];
				walkRecursiveQuantizedTreeAgainstQueryAabb(rootNode,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);
			}
			break;
		default:
			//unsupported
			btAssert(0);
		}
	} else
	{
		walkStacklessTree(nodeCallback,aabbMin,aabbMax);
	}
}